

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O2

INTERP_PRED_TYPE
is_pred_filter_search_allowed
          (AV1_COMP *cpi,MACROBLOCKD *xd,BLOCK_SIZE bsize,int_interpfilters *af,
          int_interpfilters *lf)

{
  MB_MODE_INFO *pMVar1;
  MB_MODE_INFO *pMVar2;
  byte bVar3;
  undefined7 in_register_00000011;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  
  pMVar1 = xd->left_mbmi;
  pMVar2 = xd->above_mbmi;
  bVar3 = ""[CONCAT71(in_register_00000011,bsize) & 0xffffffff];
  if ((pMVar2 != (MB_MODE_INFO *)0x0) &&
     (((pMVar2->field_0xa7 & 0x80) != 0 || ('\0' < pMVar2->ref_frame[0])))) {
    *af = pMVar2->interp_filters;
  }
  if ((pMVar1 != (MB_MODE_INFO *)0x0) &&
     (((pMVar1->field_0xa7 & 0x80) != 0 || ('\0' < pMVar1->ref_frame[0])))) {
    *lf = pMVar1->interp_filters;
  }
  bVar6 = false;
  bVar5 = false;
  if ((af->as_filters).x_filter != 0xff) {
    bVar5 = (af->as_filters).x_filter == (lf->as_filters).x_filter;
  }
  if ((af->as_filters).y_filter != 0xff) {
    bVar6 = (af->as_filters).y_filter == (lf->as_filters).y_filter;
  }
  bVar4 = 0;
  if ((cpi->sf).interp_sf.cb_pred_filter_search != 0) {
    bVar4 = (char)((uint)(xd->mi_row + xd->mi_col) >> (bVar3 & 0x1f)) +
            (char)(cpi->common).current_frame.frame_number & 1;
  }
  bVar3 = 0;
  if (bVar5 || bVar6) {
    bVar3 = bVar4;
  }
  return bVar3 * (bVar5 + bVar6 * '\x02');
}

Assistant:

static inline INTERP_PRED_TYPE is_pred_filter_search_allowed(
    const AV1_COMP *const cpi, MACROBLOCKD *xd, BLOCK_SIZE bsize,
    int_interpfilters *af, int_interpfilters *lf) {
  const AV1_COMMON *cm = &cpi->common;
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int bsl = mi_size_wide_log2[bsize];
  int is_horiz_eq = 0, is_vert_eq = 0;

  if (above_mbmi && is_inter_block(above_mbmi))
    *af = above_mbmi->interp_filters;

  if (left_mbmi && is_inter_block(left_mbmi)) *lf = left_mbmi->interp_filters;

  if (af->as_filters.x_filter != INTERP_INVALID)
    is_horiz_eq = af->as_filters.x_filter == lf->as_filters.x_filter;
  if (af->as_filters.y_filter != INTERP_INVALID)
    is_vert_eq = af->as_filters.y_filter == lf->as_filters.y_filter;

  INTERP_PRED_TYPE pred_filter_type = (is_vert_eq << 1) + is_horiz_eq;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int pred_filter_enable =
      cpi->sf.interp_sf.cb_pred_filter_search
          ? (((mi_row + mi_col) >> bsl) +
             get_chessboard_index(cm->current_frame.frame_number)) &
                0x1
          : 0;
  pred_filter_enable &= is_horiz_eq || is_vert_eq;
  // pred_filter_search = 0: pred_filter is disabled
  // pred_filter_search = 1: pred_filter is enabled and only horz pred matching
  // pred_filter_search = 2: pred_filter is enabled and only vert pred matching
  // pred_filter_search = 3: pred_filter is enabled and
  //                         both vert, horz pred matching
  return pred_filter_enable * pred_filter_type;
}